

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::RecordSet::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,RecordSet *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  RecordSet *local_18;
  RecordSet *this_local;
  
  local_18 = this;
  this_local = (RecordSet *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Record Set");
  poVar1 = std::operator<<(poVar1,"\n\tID:            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui32RecID);
  poVar1 = std::operator<<(poVar1,"\n\tSerial Number: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui32RecSetSerialNum);
  poVar1 = std::operator<<(poVar1,"\n\tLength:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16RecLen);
  poVar1 = std::operator<<(poVar1,"\n\tCount:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16RecCnt);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString RecordSet::GetAsString() const
{
    KStringStream ss;

    ss << "Record Set"
       << "\n\tID:            " << m_ui32RecID
       << "\n\tSerial Number: " << m_ui32RecSetSerialNum
       << "\n\tLength:        " << m_ui16RecLen
       << "\n\tCount:         " << m_ui16RecCnt
       << "\n";

    return ss.str();
}